

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O1

void __thiscall
ZXing::GetPatternRow<unsigned_char_const*>
          (ZXing *this,Range<const_unsigned_char_*> b_row,PatternRow *p_row)

{
  ZXing *pZVar1;
  pointer __s;
  pointer puVar2;
  uint uVar3;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  ulong uVar4;
  ulong uVar5;
  
  this_00 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)b_row._end;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (this_00,(long)(((int)b_row._begin - (int)this) + 2));
  __s = (this_00->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar2 = (this_00->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar2) {
    memset(__s,0,((long)puVar2 + (-2 - (long)__s) & 0xfffffffffffffffeU) + 2);
  }
  puVar2 = __s + (*this != (ZXing)0x0);
  pZVar1 = (ZXing *)b_row._begin + -8;
  if (this < pZVar1) {
    do {
      if (*(ulong *)this == *(ulong *)(this + 1)) {
        *puVar2 = *puVar2 + 8;
        uVar4 = 8;
      }
      else {
        uVar5 = *(ulong *)(this + 1) ^ *(ulong *)this;
        uVar4 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        uVar3 = ((uint)(uVar4 >> 3) & 0x1fffffff) + 1;
        uVar4 = (ulong)uVar3;
        *puVar2 = *puVar2 + (short)uVar3;
        puVar2 = puVar2 + 1;
      }
      this = this + uVar4;
    } while (this < pZVar1);
  }
  while (pZVar1 = this + 1, pZVar1 != (ZXing *)b_row._begin) {
    *puVar2 = *puVar2 + 1;
    puVar2 = puVar2 + (*pZVar1 != pZVar1[-1]);
    this = pZVar1;
  }
  *puVar2 = *puVar2 + 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (this_00,((long)((long)puVar2 + ((ulong)(*this != (ZXing)0x0) * 2 - (long)__s)) >> 1) +
                     1);
  return;
}

Assistant:

void GetPatternRow(Range<I> b_row, PatternRow& p_row)
{
	// TODO: if reactivating the bit-packed array (!ZX_FAST_BIT_STORAGE) should be of interest then the following code could be
	// considerably speed up by using a specialized variant along the lines of the old BitArray::getNextSetTo() function that
	// was removed between 1.4 and 2.0.

#if 0
	p_row.reserve(64);
	p_row.clear();

	auto lastPos = b_row.begin();
	if (*lastPos)
		p_row.push_back(0); // first value is number of white pixels, here 0

	for (auto p = b_row.begin() + 1; p < b_row.end(); ++p)
		if (bool(*p) != bool(*lastPos))
			p_row.push_back(p - std::exchange(lastPos, p));

	p_row.push_back(b_row.end() - lastPos);

	if (*lastPos)
		p_row.push_back(0); // last value is number of white pixels, here 0
#else
	p_row.resize(b_row.size() + 2);
	std::fill(p_row.begin(), p_row.end(), 0);

	auto bitPos = b_row.begin();
	const auto bitPosEnd = b_row.end();
	auto intPos = p_row.data();

	if (*bitPos)
		intPos++; // first value is number of white pixels, here 0

	// The following code as been observed to cause a speedup of up to 30% on large images on an AVX cpu
	// and on an a Google Pixel 3 Android phone. Your mileage may vary.
	if constexpr (std::is_pointer_v<I> && sizeof(I) == 8 && sizeof(std::remove_pointer_t<I>) == 1) {
		using simd_t = uint64_t;
		while (bitPos < bitPosEnd - sizeof(simd_t)) {
			auto asSimd0 = BitHacks::LoadU<simd_t>(bitPos);
			auto asSimd1 = BitHacks::LoadU<simd_t>(bitPos + 1);
			auto z = asSimd0 ^ asSimd1;
			if (z) {
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
				int step = BitHacks::NumberOfTrailingZeros(z) / 8 + 1;
#else
				int step = BitHacks::NumberOfLeadingZeros(z) / 8 + 1;
#endif
				(*intPos++) += step;
				bitPos += step;
			} else {
				(*intPos) += sizeof(simd_t);
				bitPos += sizeof(simd_t);
			}
		}
	}

	while (++bitPos != bitPosEnd) {
		++(*intPos);
		intPos += bitPos[0] != bitPos[-1];
	}
	++(*intPos);

	if (bitPos[-1])
		intPos++;

	p_row.resize(intPos - p_row.data() + 1);
#endif
}